

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

uint8_t __thiscall wabt::DataSegment::GetFlags(DataSegment *this,Module *module)

{
  uint8_t uVar1;
  Index IVar2;
  bool bVar3;
  
  bVar3 = this->kind == Passive;
  IVar2 = BindingHash::FindIndex(&module->memory_bindings,&this->memory_var);
  uVar1 = bVar3 + '\x02';
  if (IVar2 == 0) {
    uVar1 = bVar3;
  }
  return uVar1;
}

Assistant:

uint8_t DataSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  if (kind == SegmentKind::Passive) {
    flags |= SegPassive;
  }

  Index memory_index = module->GetMemoryIndex(memory_var);
  if (memory_index != 0) {
    flags |= SegExplicitIndex;
  }

  return flags;
}